

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

string * __thiscall
t_rb_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rb_generator *this,t_type *ttype)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string name;
  string prefix;
  char *local_b0;
  undefined8 local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  undefined8 local_48;
  char local_40 [8];
  undefined8 uStack_38;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  lVar1 = *(long *)CONCAT44(extraout_var,iVar3);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,lVar1,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar1);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar3 == '\0') goto LAB_00328f1c;
    }
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  lVar1 = *(long *)CONCAT44(extraout_var_00,iVar3);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,lVar1,((long *)CONCAT44(extraout_var_00,iVar3))[1] + lVar1);
  pcVar2 = local_b0;
  iVar3 = toupper((int)*local_b0);
  *pcVar2 = (char)iVar3;
  if (local_b0 == local_a0) {
    uStack_38 = uStack_98;
    local_50 = local_40;
  }
  else {
    local_50 = local_b0;
  }
  local_48 = local_a8;
  local_a8 = 0;
  local_a0[0] = '\0';
  local_b0 = local_a0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
LAB_00328f1c:
  std::operator+(__return_storage_ptr__,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rb_generator::type_name(const t_type* ttype) {
  string prefix = "";

  string name = ttype->get_name();
  if (ttype->is_struct() || ttype->is_xception() || ttype->is_enum()) {
    name = capitalize(ttype->get_name());
  }

  return prefix + name;
}